

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

shared_ptr<aeron::Publication> __thiscall
aeron::ClientConductor::findPublication(ClientConductor *this,int64_t registrationId)

{
  bool bVar1;
  longlong lVar2;
  char *pcVar3;
  undefined8 uVar4;
  RegistrationException *this_00;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<aeron::Publication> sVar5;
  UnsafeBufferPosition publicationLimit;
  PublicationStateDefn *state;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  it;
  lock_guard<std::recursive_mutex> lock;
  shared_ptr<aeron::Publication> *pub;
  mutex_type *in_stack_fffffffffffffda8;
  int32_t *__r;
  string *in_stack_fffffffffffffdb0;
  int iVar6;
  UnsafeBufferPosition *this_01;
  string *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  anon_class_8_1_0d1909f2_for__M_pred in_stack_fffffffffffffdc8;
  allocator *paVar7;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  in_stack_fffffffffffffdd0;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  in_stack_fffffffffffffdd8;
  long in_stack_fffffffffffffdf8;
  int *in_stack_fffffffffffffe00;
  long *in_stack_fffffffffffffe08;
  long *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  RegistrationStatus RVar8;
  undefined6 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe56;
  allocator in_stack_fffffffffffffe57;
  UnsafeBufferPosition *in_stack_fffffffffffffe58;
  int *in_stack_fffffffffffffe60;
  shared_ptr<aeron::LogBuffers> *in_stack_fffffffffffffe68;
  allocator local_181;
  string local_180 [64];
  UnsafeBufferPosition local_140;
  undefined1 local_11a;
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_69;
  reference local_68;
  undefined4 local_5c;
  PublicationStateDefn *local_58;
  undefined8 local_40;
  PublicationStateDefn *local_38;
  PublicationStateDefn *local_30;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  local_28 [2];
  undefined8 local_18;
  
  local_18 = in_RDX;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8
            );
  local_30 = (PublicationStateDefn *)
             std::
             vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
             ::begin((vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
                      *)in_stack_fffffffffffffda8);
  local_38 = (PublicationStateDefn *)
             std::
             vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
             ::end((vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
                    *)in_stack_fffffffffffffda8);
  local_40 = local_18;
  local_28[0] = std::
                find_if<__gnu_cxx::__normal_iterator<aeron::ClientConductor::PublicationStateDefn*,std::vector<aeron::ClientConductor::PublicationStateDefn,std::allocator<aeron::ClientConductor::PublicationStateDefn>>>,aeron::ClientConductor::findPublication(long)::__0>
                          (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                           in_stack_fffffffffffffdc8);
  local_58 = (PublicationStateDefn *)
             std::
             vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
             ::end((vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
                    *)in_stack_fffffffffffffda8);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
                      *)in_stack_fffffffffffffdb0,
                     (__normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
                      *)in_stack_fffffffffffffda8);
  iVar6 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  if (bVar1) {
    std::shared_ptr<aeron::Publication>::shared_ptr((shared_ptr<aeron::Publication> *)0x1f2ae1);
  }
  else {
    local_68 = __gnu_cxx::
               __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
               ::operator*(local_28);
    local_69 = 0;
    std::weak_ptr<aeron::Publication>::lock
              ((weak_ptr<aeron::Publication> *)in_stack_fffffffffffffdb8);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
    if (!bVar1) {
      RVar8 = local_68->m_status;
      if (RVar8 == AWAITING_MEDIA_DRIVER) {
        lVar2 = std::function<long_long_()>::operator()
                          ((function<long_long_()> *)in_stack_fffffffffffffdb0);
        iVar6 = (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
        if (local_68->m_timeOfRegistration + *(long *)(in_RSI + 0x210) < lVar2) {
          local_11a = 1;
          uVar4 = __cxa_allocate_exception(0x48);
          std::__cxx11::to_string(in_stack_fffffffffffffdf8);
          std::operator+(&local_b0,"no response from driver in ",&local_d0);
          std::operator+(&local_90,&local_b0," ms");
          paVar7 = &local_f1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_f0,
                     "std::shared_ptr<Publication> aeron::ClientConductor::findPublication(std::int64_t)"
                     ,paVar7);
          pcVar3 = util::past_prefix((char *)in_stack_fffffffffffffdc0,
                                     (char *)in_stack_fffffffffffffdb8);
          paVar7 = &local_119;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_118,pcVar3,paVar7);
          util::DriverTimeoutException::DriverTimeoutException
                    ((DriverTimeoutException *)in_stack_fffffffffffffdd0._M_current,
                     (string *)in_stack_fffffffffffffdc8.registrationId,in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8,iVar6);
          local_11a = 0;
          __cxa_throw(uVar4,&util::DriverTimeoutException::typeinfo,
                      util::DriverTimeoutException::~DriverTimeoutException);
        }
      }
      else if (RVar8 == REGISTERED_MEDIA_DRIVER) {
        concurrent::status::UnsafeBufferPosition::UnsafeBufferPosition
                  ((UnsafeBufferPosition *)in_stack_fffffffffffffdd0._M_current,
                   (AtomicBuffer *)in_stack_fffffffffffffdc8.registrationId,
                   (int32_t)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
        __r = &local_68->m_sessionId;
        this_01 = &local_140;
        std::
        make_shared<aeron::Publication,aeron::ClientConductor&,std::__cxx11::string&,long&,long&,int&,int&,aeron::concurrent::status::UnsafeBufferPosition&,int&,std::shared_ptr<aeron::LogBuffers>&>
                  ((ClientConductor *)CONCAT44(RVar8,in_stack_fffffffffffffe20),
                   in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   in_stack_fffffffffffffe00,
                   (int *)CONCAT17(in_stack_fffffffffffffe57,
                                   CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
                   in_stack_fffffffffffffe58,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
        std::shared_ptr<aeron::Publication>::operator=
                  ((shared_ptr<aeron::Publication> *)this_01,(shared_ptr<aeron::Publication> *)__r);
        std::shared_ptr<aeron::Publication>::~shared_ptr((shared_ptr<aeron::Publication> *)0x1f2eea)
        ;
        std::weak_ptr<aeron::Publication>::weak_ptr<aeron::Publication,void>
                  ((weak_ptr<aeron::Publication> *)this_01,(shared_ptr<aeron::Publication> *)__r);
        std::weak_ptr<aeron::Publication>::operator=
                  ((weak_ptr<aeron::Publication> *)this_01,(weak_ptr<aeron::Publication> *)__r);
        std::weak_ptr<aeron::Publication>::~weak_ptr((weak_ptr<aeron::Publication> *)0x1f2f28);
        local_5c = 2;
        concurrent::status::UnsafeBufferPosition::~UnsafeBufferPosition(&local_140);
      }
      else if (RVar8 == ERRORED_MEDIA_DRIVER) {
        uVar4 = __cxa_allocate_exception(0x50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_180,
                   "std::shared_ptr<Publication> aeron::ClientConductor::findPublication(std::int64_t)"
                   ,&local_181);
        this_00 = (RegistrationException *)
                  util::past_prefix((char *)in_stack_fffffffffffffdc0,
                                    (char *)in_stack_fffffffffffffdb8);
        paVar7 = (allocator *)&stack0xfffffffffffffe57;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&stack0xfffffffffffffe58,(char *)this_00,paVar7);
        util::RegistrationException::RegistrationException
                  (this_00,(int32_t)((ulong)paVar7 >> 0x20),in_stack_fffffffffffffdc0,
                   in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,iVar6);
        __cxa_throw(uVar4,&util::RegistrationException::typeinfo,
                    util::RegistrationException::~RegistrationException);
      }
    }
    local_69 = 1;
  }
  local_5c = 1;
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1f3148);
  sVar5.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<aeron::Publication>)
         sVar5.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Publication> ClientConductor::findPublication(std::int64_t registrationId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(m_publications.begin(), m_publications.end(),
        [registrationId](const PublicationStateDefn &entry)
        {
            return (registrationId == entry.m_registrationId);
        });

    if (it == m_publications.end())
    {
        return std::shared_ptr<Publication>();
    }

    PublicationStateDefn& state = (*it);
    std::shared_ptr<Publication> pub(state.m_publication.lock());

    if (!pub)
    {
        switch (state.m_status)
        {
            case RegistrationStatus::AWAITING_MEDIA_DRIVER:
                if (m_epochClock() > (state.m_timeOfRegistration + m_driverTimeoutMs))
                {
                    throw DriverTimeoutException(
                        "no response from driver in " + std::to_string(m_driverTimeoutMs) +" ms", SOURCEINFO);
                }
                break;

            case RegistrationStatus::REGISTERED_MEDIA_DRIVER:
            {
                UnsafeBufferPosition publicationLimit(m_counterValuesBuffer, state.m_publicationLimitCounterId);

                pub = std::make_shared<Publication>(
                    *this, state.m_channel, state.m_registrationId, state.m_originalRegistrationId,
                    state.m_streamId, state.m_sessionId, publicationLimit, state.m_channelStatusId, state.m_buffers);

                state.m_publication = std::weak_ptr<Publication>(pub);
                break;
            }

            case RegistrationStatus::ERRORED_MEDIA_DRIVER:
                throw RegistrationException(state.m_errorCode, state.m_errorMessage, SOURCEINFO);
        }
    }

    return pub;
}